

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O2

void raise_mmu_exception(CPURISCVState_conflict1 *env,target_ulong address,MMUAccessType access_type
                        ,_Bool pmp_violation,_Bool first_stage)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  undefined3 in_register_00000081;
  
  lVar2 = 0x328;
  if ((CONCAT31(in_register_00000081,first_stage) == 0) || (lVar2 = 0x2a0, 0x10fff < env->priv_ver))
  {
    bVar3 = !pmp_violation && *(ulong *)((long)env->gpr + lVar2) >> 0x3c != 0;
  }
  else {
    bVar3 = false;
  }
  if (access_type == MMU_DATA_LOAD) {
    if (((env->misa & 0x80) == 0) || (((byte)env->virt & !first_stage) == 0)) {
      iVar1 = (uint)bVar3 * 8 + 5;
    }
    else {
      iVar1 = 0x15;
    }
  }
  else if (access_type == MMU_DATA_STORE) {
    if (((env->misa & 0x80) == 0) || (((byte)env->virt & !first_stage) == 0)) {
      iVar1 = (uint)bVar3 * 8 + 7;
    }
    else {
      iVar1 = 0x17;
    }
  }
  else {
    if (access_type != MMU_INST_FETCH) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                 ,0x273,(char *)0x0);
    }
    if (((env->misa & 0x80) == 0) || (((byte)env->virt & !first_stage) == 0)) {
      iVar1 = 1;
      if (bVar3 != false) {
        iVar1 = 0xc;
      }
    }
    else {
      iVar1 = 0x14;
    }
  }
  *(int *)(env[-2].gpr + 0x1a) = iVar1;
  env->badaddr = address;
  return;
}

Assistant:

static void raise_mmu_exception(CPURISCVState *env, target_ulong address,
                                MMUAccessType access_type, bool pmp_violation,
                                bool first_stage)
{
    CPUState *cs = env_cpu(env);
    int page_fault_exceptions;
    if (first_stage) {
        page_fault_exceptions =
            (env->priv_ver >= PRIV_VERSION_1_10_0) &&
            get_field(env->satp, SATP_MODE) != VM_1_10_MBARE &&
            !pmp_violation;
    } else {
        page_fault_exceptions =
            get_field(env->hgatp, HGATP_MODE) != VM_1_10_MBARE &&
            !pmp_violation;
    }
    switch (access_type) {
    case MMU_INST_FETCH:
        if (riscv_cpu_virt_enabled(env) && !first_stage) {
            cs->exception_index = RISCV_EXCP_INST_GUEST_PAGE_FAULT;
        } else {
            cs->exception_index = page_fault_exceptions ?
                RISCV_EXCP_INST_PAGE_FAULT : RISCV_EXCP_INST_ACCESS_FAULT;
        }
        break;
    case MMU_DATA_LOAD:
        if (riscv_cpu_virt_enabled(env) && !first_stage) {
            cs->exception_index = RISCV_EXCP_LOAD_GUEST_ACCESS_FAULT;
        } else {
            cs->exception_index = page_fault_exceptions ?
                RISCV_EXCP_LOAD_PAGE_FAULT : RISCV_EXCP_LOAD_ACCESS_FAULT;
        }
        break;
    case MMU_DATA_STORE:
        if (riscv_cpu_virt_enabled(env) && !first_stage) {
            cs->exception_index = RISCV_EXCP_STORE_GUEST_AMO_ACCESS_FAULT;
        } else {
            cs->exception_index = page_fault_exceptions ?
                RISCV_EXCP_STORE_PAGE_FAULT : RISCV_EXCP_STORE_AMO_ACCESS_FAULT;
        }
        break;
    default:
        g_assert_not_reached();
    }
    env->badaddr = address;
}